

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O3

UChar * __thiscall
icu_63::TZGNCore::getGenericLocationName(TZGNCore *this,UnicodeString *tzCanonicalID)

{
  short sVar1;
  int iVar2;
  int32_t iVar3;
  UChar *pUVar4;
  UChar *key;
  undefined4 *value;
  UErrorCode status;
  UBool isPrimary;
  char countryCode [4];
  UnicodeString country;
  UnicodeString name;
  UnicodeString usCountryCode;
  UChar tzIDKey [129];
  UErrorCode local_20c;
  UBool local_205;
  char local_204 [4];
  Char16Ptr local_200;
  char16_t *local_1f8;
  UnicodeString local_1e8;
  UnicodeString local_1a8;
  UnicodeString local_168;
  char16_t local_128 [136];
  
  sVar1 = (tzCanonicalID->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (tzCanonicalID->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  if (0x80 < iVar2) {
    return (UChar *)0x0;
  }
  local_20c = U_ZERO_ERROR;
  local_200.p_ = local_128;
  iVar3 = UnicodeString::extract(tzCanonicalID,&local_200,0x81,&local_20c);
  local_1f8 = local_200.p_;
  local_128[iVar3] = L'\0';
  pUVar4 = (UChar *)uhash_get_63(this->fLocationNamesMap,local_128);
  if (pUVar4 != (UChar *)0x0) {
    if (pUVar4 == L"") {
      return (UChar *)0x0;
    }
    return pUVar4;
  }
  local_1a8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8;
  local_1a8.fUnion.fStackFields.fLengthAndFlags = 2;
  local_168.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8;
  local_168.fUnion.fStackFields.fLengthAndFlags = 2;
  local_205 = '\0';
  ZoneMeta::getCanonicalCountry(tzCanonicalID,&local_168,&local_205);
  if ((ushort)local_168.fUnion.fStackFields.fLengthAndFlags < 0x20) {
LAB_0020264e:
    if ((ushort)local_1a8.fUnion.fStackFields.fLengthAndFlags < 0x20) {
      pUVar4 = (UChar *)0x0;
    }
    else {
      pUVar4 = ZNStringPool::get(&this->fStringPool,&local_1a8,&local_20c);
    }
    if (U_ZERO_ERROR < local_20c) goto LAB_002026f5;
    key = ZoneMeta::findTimeZoneID(tzCanonicalID);
    if (pUVar4 == (UChar *)0x0) {
      uhash_put_63(this->fLocationNamesMap,key,&gEmpty,&local_20c);
    }
    else {
      uhash_put_63(this->fLocationNamesMap,key,pUVar4,&local_20c);
      if (local_20c < U_ILLEGAL_ARGUMENT_ERROR) {
        value = (undefined4 *)uprv_malloc_63(0x10);
        if (value != (undefined4 *)0x0) {
          *value = 1;
          *(UChar **)(value + 2) = key;
          TextTrieMap::put(&this->fGNamesTrie,pUVar4,value,&local_20c);
        }
        goto LAB_002026f5;
      }
    }
  }
  else {
    if (local_205 == '\0') {
      local_1e8.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)&PTR__UnicodeString_003e5ab8;
      local_1e8.fUnion.fStackFields.fLengthAndFlags = 2;
      (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xb])
                (this->fTimeZoneNames,tzCanonicalID);
      SimpleFormatter::format(&this->fRegionFormat,&local_1e8,&local_1a8,&local_20c);
    }
    else {
      if (-1 < local_168.fUnion.fStackFields.fLengthAndFlags) {
        local_168.fUnion.fFields.fLength = (int)local_168.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar3 = UnicodeString::extract
                        (&local_168,0,local_168.fUnion.fFields.fLength,local_204,4,kInvariant);
      local_204[iVar3] = '\0';
      local_1e8.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)&PTR__UnicodeString_003e5ab8;
      local_1e8.fUnion.fStackFields.fLengthAndFlags = 2;
      (*(this->fLocaleDisplayNames->super_UObject)._vptr_UObject[0xb])
                (this->fLocaleDisplayNames,local_204);
      SimpleFormatter::format(&this->fRegionFormat,&local_1e8,&local_1a8,&local_20c);
    }
    UnicodeString::~UnicodeString(&local_1e8);
    if (local_20c < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0020264e;
  }
  pUVar4 = (UChar *)0x0;
LAB_002026f5:
  UnicodeString::~UnicodeString(&local_168);
  UnicodeString::~UnicodeString(&local_1a8);
  return pUVar4;
}

Assistant:

const UChar*
TZGNCore::getGenericLocationName(const UnicodeString& tzCanonicalID) {
    U_ASSERT(!tzCanonicalID.isEmpty());
    if (tzCanonicalID.length() > ZID_KEY_MAX) {
        return NULL;
    }

    UErrorCode status = U_ZERO_ERROR;
    UChar tzIDKey[ZID_KEY_MAX + 1];
    int32_t tzIDKeyLen = tzCanonicalID.extract(tzIDKey, ZID_KEY_MAX + 1, status);
    U_ASSERT(status == U_ZERO_ERROR);   // already checked length above
    tzIDKey[tzIDKeyLen] = 0;

    const UChar *locname = (const UChar *)uhash_get(fLocationNamesMap, tzIDKey);

    if (locname != NULL) {
        // gEmpty indicate the name is not available
        if (locname == gEmpty) {
            return NULL;
        }
        return locname;
    }

    // Construct location name
    UnicodeString name;
    UnicodeString usCountryCode;
    UBool isPrimary = FALSE;

    ZoneMeta::getCanonicalCountry(tzCanonicalID, usCountryCode, &isPrimary);

    if (!usCountryCode.isEmpty()) {
        if (isPrimary) {
            // If this is the primary zone in the country, use the country name.
            char countryCode[ULOC_COUNTRY_CAPACITY];
            U_ASSERT(usCountryCode.length() < ULOC_COUNTRY_CAPACITY);
            int32_t ccLen = usCountryCode.extract(0, usCountryCode.length(), countryCode, sizeof(countryCode), US_INV);
            countryCode[ccLen] = 0;

            UnicodeString country;
            fLocaleDisplayNames->regionDisplayName(countryCode, country);
            fRegionFormat.format(country, name, status);
        } else {
            // If this is not the primary zone in the country,
            // use the exemplar city name.

            // getExemplarLocationName should retur non-empty string
            // if the time zone is associated with a region

            UnicodeString city;
            fTimeZoneNames->getExemplarLocationName(tzCanonicalID, city);
            fRegionFormat.format(city, name, status);
        }
        if (U_FAILURE(status)) {
            return NULL;
        }
    }

    locname = name.isEmpty() ? NULL : fStringPool.get(name, status);
    if (U_SUCCESS(status)) {
        // Cache the result
        const UChar* cacheID = ZoneMeta::findTimeZoneID(tzCanonicalID);
        U_ASSERT(cacheID != NULL);
        if (locname == NULL) {
            // gEmpty to indicate - no location name available
            uhash_put(fLocationNamesMap, (void *)cacheID, (void *)gEmpty, &status);
        } else {
            uhash_put(fLocationNamesMap, (void *)cacheID, (void *)locname, &status);
            if (U_FAILURE(status)) {
                locname = NULL;
            } else {
                // put the name info into the trie
                GNameInfo *nameinfo = (ZNameInfo *)uprv_malloc(sizeof(GNameInfo));
                if (nameinfo != NULL) {
                    nameinfo->type = UTZGNM_LOCATION;
                    nameinfo->tzID = cacheID;
                    fGNamesTrie.put(locname, nameinfo, status);
                }
            }
        }
    }

    return locname;
}